

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O0

void Rwt_Man4ExplorePrint(void)

{
  void *__s;
  void *__ptr;
  int *pReprs;
  int *pDistrib;
  uint local_20;
  int nClasses;
  int nCuts;
  int CountWrite;
  int CountMax;
  int i;
  FILE *pFile;
  
  pDistrib._4_4_ = 0;
  local_20 = 0;
  nCuts = 0;
  for (CountWrite = 0; CountWrite < s_pManRwrExp4->nFuncs; CountWrite = CountWrite + 1) {
    if (nCuts < s_pManRwrExp4->pnCounts[CountWrite]) {
      nCuts = s_pManRwrExp4->pnCounts[CountWrite];
    }
    local_20 = s_pManRwrExp4->pnCounts[CountWrite] + local_20;
    if (0 < s_pManRwrExp4->pnCounts[CountWrite]) {
      pDistrib._4_4_ = pDistrib._4_4_ + 1;
    }
  }
  printf("Number of cuts considered       = %8d.\n",(ulong)local_20);
  printf("Classes occurring at least once = %8d.\n");
  __s = malloc((long)(nCuts + 1) << 2);
  __ptr = malloc((long)(nCuts + 1) << 2);
  memset(__s,0,(long)(nCuts + 1) << 2);
  for (CountWrite = 0; CountWrite < s_pManRwrExp4->nFuncs; CountWrite = CountWrite + 1) {
    *(int *)((long)__s + (long)s_pManRwrExp4->pnCounts[CountWrite] * 4) =
         *(int *)((long)__s + (long)s_pManRwrExp4->pnCounts[CountWrite] * 4) + 1;
    *(int *)((long)__ptr + (long)s_pManRwrExp4->pnCounts[CountWrite] * 4) = CountWrite;
  }
  printf("Occurence = %6d.  Num classes = %4d.  \n",0,(ulong)(0x8f0 - pDistrib._4_4_));
  for (CountWrite = 1; CountWrite <= nCuts; CountWrite = CountWrite + 1) {
    if (*(int *)((long)__s + (long)CountWrite * 4) != 0) {
      printf("Occurence = %6d.  Num classes = %4d.  Repr = ",(ulong)(uint)CountWrite,
             (ulong)*(uint *)((long)__s + (long)CountWrite * 4));
      Extra_PrintBinary(_stdout,(uint *)((long)__ptr + (long)CountWrite * 4),0x10);
      printf("\n");
    }
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  nClasses = 0;
  _CountMax = fopen("npnclass_stats4.txt","w");
  for (CountWrite = 0; CountWrite < s_pManRwrExp4->nFuncs; CountWrite = CountWrite + 1) {
    if (0 < s_pManRwrExp4->pnCounts[CountWrite]) {
      Extra_PrintHex((FILE *)_CountMax,(uint *)&CountWrite,4);
      fprintf(_CountMax," %10d\n",(ulong)(uint)s_pManRwrExp4->pnCounts[CountWrite]);
      nClasses = nClasses + 1;
    }
  }
  fclose(_CountMax);
  printf("%d classes written into file \"%s\".\n",(ulong)(uint)nClasses,"npnclass_stats4.txt");
  return;
}

Assistant:

void Rwt_Man4ExplorePrint()
{
    FILE * pFile;
    int i, CountMax, CountWrite, nCuts, nClasses;
    int * pDistrib;
    int * pReprs;
    // find the max number of occurences
    nCuts = nClasses = 0;
    CountMax = 0;
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        if ( CountMax < s_pManRwrExp4->pnCounts[i] )
            CountMax = s_pManRwrExp4->pnCounts[i];
        nCuts += s_pManRwrExp4->pnCounts[i];
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
            nClasses++;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", nClasses );
    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( int, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        pDistrib[ s_pManRwrExp4->pnCounts[i] ]++;
        pReprs[ s_pManRwrExp4->pnCounts[i] ] = i;
    }

    printf( "Occurence = %6d.  Num classes = %4d.  \n", 0, 2288-nClasses );
    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, (unsigned*)&(pReprs[i]), 16 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );
    // write into a file all classes above limit (5)
    CountWrite = 0;
    pFile = fopen( "npnclass_stats4.txt", "w" );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
        {
            Extra_PrintHex( pFile, (unsigned *)&i, 4 );
            fprintf( pFile, " %10d\n", s_pManRwrExp4->pnCounts[i] );
//            fprintf( pFile, "%d ", i );
            CountWrite++;
        }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", CountWrite, "npnclass_stats4.txt" );
}